

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::PiecewiseLinear2D<3UL>::PiecewiseLinear2D
          (PiecewiseLinear2D<3UL> *this,Allocator alloc,float *data,int xSize,int ySize,
          array<int,_3> param_res,array<const_float_*,_3> param_values,bool normalize,bool build_cdf
          )

{
  float *__src;
  int *piVar1;
  reference this_00;
  pointer __dest;
  float **ppfVar2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_01;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_02;
  int in_ECX;
  long in_RDX;
  int *in_RDI;
  int in_R8D;
  byte in_R9B;
  float fVar3;
  byte in_stack_00000030;
  uint32_t k;
  float avg;
  float v11;
  float v01;
  float v10;
  float v00;
  int x_1;
  size_t i_6;
  int y_2;
  double sum_2;
  float normalization_1;
  uint32_t slice_1;
  float *data_out_1;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  float normalization;
  int y_1;
  double sum;
  int x;
  size_t i_2;
  double sum_1;
  int y;
  uint32_t slice;
  float *data_out;
  float *conditional_cdf;
  float *marginal_cdf;
  uint32_t n_values;
  int i_1;
  int i;
  uint32_t slices;
  float in_stack_fffffffffffffd28;
  float in_stack_fffffffffffffd2c;
  Tuple2<pbrt::Vector2,_int> in_stack_fffffffffffffd30;
  Tuple2<pbrt::Vector2,_int> in_stack_fffffffffffffd38;
  undefined1 *count;
  vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
  *in_stack_fffffffffffffd40;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffd48;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_03;
  uint local_29c;
  undefined4 in_stack_fffffffffffffdd8;
  array<const_float_*,_3> *this_04;
  array<int,_3> *this_05;
  uint local_1cc;
  int local_1b4;
  long local_1b0;
  int local_1a4;
  double local_1a0;
  float local_190;
  uint local_18c;
  pointer local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  int local_164;
  int local_154;
  long local_150;
  int local_140;
  uint local_13c;
  pointer local_138;
  pointer local_130;
  pointer local_128;
  undefined1 local_120 [40];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_f8 [2];
  uint local_a4;
  int local_74;
  uint local_70;
  uint local_6c;
  polymorphic_allocator<float> local_68;
  polymorphic_allocator<float> local_60 [3];
  polymorphic_allocator<float> local_48;
  polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_> local_40 [2]
  ;
  Tuple2<pbrt::Vector2,_int> local_2c;
  byte local_22;
  byte local_21;
  int local_20;
  int local_1c;
  long local_18;
  
  this_04 = (array<const_float_*,_3> *)&stack0x00000018;
  this_05 = (array<int,_3> *)&stack0x00000008;
  local_21 = in_R9B & 1;
  local_22 = in_stack_00000030 & 1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  Vector2<int>::Vector2
            ((Vector2<int> *)in_stack_fffffffffffffd30,(int)in_stack_fffffffffffffd2c,
             (int)in_stack_fffffffffffffd28);
  Vector2<float>::Vector2
            ((Vector2<float> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
             in_stack_fffffffffffffd28);
  Vector2<int>::Vector2
            ((Vector2<int> *)in_stack_fffffffffffffd30,(int)in_stack_fffffffffffffd2c,
             (int)in_stack_fffffffffffffd28);
  local_2c = (Tuple2<pbrt::Vector2,_int>)
             Tuple2<pbrt::Vector2,int>::operator-
                       ((Tuple2<pbrt::Vector2,_int> *)in_stack_fffffffffffffd30,
                        (Vector2<int>)in_stack_fffffffffffffd38);
  Vector2<float>::Vector2<int>
            ((Vector2<float> *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
             (Vector2<int>)in_stack_fffffffffffffd30);
  pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>::
  polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>
              *)in_stack_fffffffffffffd30,
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  pstd::
  vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
  ::vector((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
            *)(in_RDI + 0xc),local_40);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)in_stack_fffffffffffffd30,
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x14),&local_48);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)in_stack_fffffffffffffd30,
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x1c),local_60);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)in_stack_fffffffffffffd30,
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x24),&local_68);
  if (((local_22 & 1) != 0) && ((local_21 & 1) == 0)) {
    LogFatal((LogLevel)((ulong)this_05 >> 0x20),(char *)this_04,(int)((ulong)in_RDX >> 0x20),
             (char *)CONCAT44(in_ECX,in_stack_fffffffffffffdd8));
  }
  local_6c = 1;
  for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
    pstd::
    vector<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,pstd::pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>>
    ::emplace_back<pstd::pmr::polymorphic_allocator<std::byte>&>
              (in_stack_fffffffffffffd40,
               (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffd38);
  }
  local_74 = 2;
  while( true ) {
    if (local_74 < 0) {
      local_a4 = local_1c * local_20;
      pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
                ((polymorphic_allocator<float> *)in_stack_fffffffffffffd30);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                 (polymorphic_allocator<float> *)in_stack_fffffffffffffd30);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (in_stack_fffffffffffffd48,
                 (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 in_stack_fffffffffffffd40);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 in_stack_fffffffffffffd30);
      if ((local_22 & 1) == 0) {
        local_188 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                               (in_RDI + 0x14));
        for (local_18c = 0; local_18c < local_6c; local_18c = local_18c + 1) {
          local_190 = HProd<pbrt::Vector2,float>(*(Tuple2<pbrt::Vector2,_float> *)(in_RDI + 4));
          local_190 = 1.0 / local_190;
          if ((local_21 & 1) != 0) {
            local_1a0 = 0.0;
            for (local_1a4 = 0; local_1a4 < in_RDI[1] + -1; local_1a4 = local_1a4 + 1) {
              local_1b0 = (long)(local_1a4 * local_1c);
              for (local_1b4 = 0; local_1b4 < *in_RDI + -1; local_1b4 = local_1b4 + 1) {
                local_1a0 = (double)((*(float *)(local_18 + local_1b0 * 4) +
                                      *(float *)(local_18 + 4 + local_1b0 * 4) +
                                      *(float *)(local_18 + (local_1b0 + local_1c) * 4) +
                                     *(float *)(local_18 + (local_1b0 + 1 + (long)local_1c) * 4)) *
                                    0.25) + local_1a0;
                local_1b0 = local_1b0 + 1;
              }
            }
            local_190 = (float)(1.0 / local_1a0);
          }
          for (local_1cc = 0; local_1cc < local_a4; local_1cc = local_1cc + 1) {
            local_188[local_1cc] = *(float *)(local_18 + (ulong)local_1cc * 4) * local_190;
          }
          local_18 = local_18 + (ulong)local_a4 * 4;
          local_188 = local_188 + local_a4;
        }
      }
      else {
        this_01 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                  (ulong)(local_6c * in_RDI[1]);
        this_03 = local_f8;
        pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
                  ((polymorphic_allocator<float> *)in_stack_fffffffffffffd30);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                  (this_01,(size_t)in_stack_fffffffffffffd38,
                   (polymorphic_allocator<float> *)in_stack_fffffffffffffd30);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(this_03,this_01);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                  ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                   in_stack_fffffffffffffd30);
        this_02 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                  (ulong)(local_6c * local_a4);
        count = local_120;
        pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
                  ((polymorphic_allocator<float> *)this_02);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                  (this_01,(size_t)count,&this_02->alloc);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(this_03,this_01);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(this_02);
        local_128 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                               (in_RDI + 0x1c));
        local_130 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                               (in_RDI + 0x24));
        local_138 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                               (in_RDI + 0x14));
        for (local_13c = 0; local_13c < local_6c; local_13c = local_13c + 1) {
          for (local_140 = 0; local_140 < in_RDI[1]; local_140 = local_140 + 1) {
            fVar3 = 0.0;
            local_150 = (long)(local_140 * local_1c);
            local_130[local_150] = 0.0;
            for (local_154 = 0; local_154 < *in_RDI + -1; local_154 = local_154 + 1) {
              fVar3 = (*(float *)(local_18 + local_150 * 4) +
                      *(float *)(local_18 + 4 + local_150 * 4)) * 0.5 + fVar3;
              local_130[local_150 + 1] = fVar3;
              local_150 = local_150 + 1;
            }
          }
          *local_128 = 0.0;
          fVar3 = 0.0;
          for (local_164 = 0; local_164 < in_RDI[1] + -1; local_164 = local_164 + 1) {
            fVar3 = (local_130[(local_164 + 1) * local_1c + -1] +
                    local_130[(local_164 + 2) * local_1c + -1]) * 0.5 + fVar3;
            local_128[local_164 + 1] = fVar3;
          }
          fVar3 = 1.0 / local_128[in_RDI[1] + -1];
          for (local_170 = 0; local_170 < local_a4; local_170 = local_170 + 1) {
            local_130[local_170] = fVar3 * local_130[local_170];
          }
          for (local_178 = 0; local_178 < (ulong)(long)in_RDI[1]; local_178 = local_178 + 1) {
            local_128[local_178] = fVar3 * local_128[local_178];
          }
          for (local_180 = 0; local_180 < local_a4; local_180 = local_180 + 1) {
            local_138[local_180] = *(float *)(local_18 + local_180 * 4) * fVar3;
          }
          local_128 = local_128 + in_RDI[1];
          local_130 = local_130 + local_a4;
          local_138 = local_138 + local_a4;
          local_18 = local_18 + (ulong)local_a4 * 4;
        }
      }
      return;
    }
    piVar1 = pstd::array<int,_3>::operator[](this_05,(long)local_74);
    if (*piVar1 < 1) break;
    piVar1 = pstd::array<int,_3>::operator[](this_05,(long)local_74);
    in_RDI[(long)local_74 + 6] = *piVar1;
    pstd::array<int,_3>::operator[](this_05,(long)local_74);
    pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
              ((polymorphic_allocator<float> *)in_stack_fffffffffffffd30);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffffd40,
               (size_t)in_stack_fffffffffffffd38,
               (polymorphic_allocator<float> *)in_stack_fffffffffffffd30);
    pstd::
    vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
    ::operator[]((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
                  *)(in_RDI + 0xc),(long)local_74);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (in_stack_fffffffffffffd48,
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffffd40)
    ;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffffd30)
    ;
    this_00 = pstd::
              vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
              ::operator[]((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
                            *)(in_RDI + 0xc),(long)local_74);
    __dest = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_00);
    ppfVar2 = pstd::array<const_float_*,_3>::operator[](this_04,(long)local_74);
    __src = *ppfVar2;
    piVar1 = pstd::array<int,_3>::operator[](this_05,(long)local_74);
    memcpy(__dest,__src,(long)*piVar1 << 2);
    piVar1 = pstd::array<int,_3>::operator[](this_05,(long)local_74);
    if (*piVar1 < 2) {
      local_29c = 0;
    }
    else {
      local_29c = local_6c;
    }
    in_RDI[(long)local_74 + 9] = local_29c;
    local_6c = in_RDI[(long)local_74 + 6] * local_6c;
    local_74 = local_74 + -1;
  }
  LogFatal((LogLevel)((ulong)this_05 >> 0x20),(char *)this_04,(int)((ulong)in_RDX >> 0x20),
           (char *)CONCAT44(in_ECX,in_stack_fffffffffffffdd8));
}

Assistant:

PiecewiseLinear2D(Allocator alloc, const float *data, int xSize, int ySize,
                      pstd::array<int, Dimension> param_res = {},
                      pstd::array<const float *, Dimension> param_values = {},
                      bool normalize = true, bool build_cdf = true)
        : m_size(xSize, ySize),
          m_patch_size(1.f / (xSize - 1), 1.f / (ySize - 1)),
          m_inv_patch_size(m_size - Vector2i(1, 1)),
          m_param_values(alloc),
          m_data(alloc),
          m_marginal_cdf(alloc),
          m_conditional_cdf(alloc) {
        if (build_cdf && !normalize)
            LOG_FATAL("PiecewiseLinear2D: build_cdf implies normalize=true");

        /* Keep track of the dependence on additional parameters (optional) */
        uint32_t slices = 1;
        for (int i = 0; i < ArraySize; ++i)
            m_param_values.emplace_back(alloc);
        for (int i = (int)Dimension - 1; i >= 0; --i) {
            if (param_res[i] < 1)
                LOG_FATAL("PiecewiseLinear2D(): parameter resolution must be >= 1!");

            m_param_size[i] = param_res[i];
            m_param_values[i] = FloatStorage(param_res[i]);
            memcpy(m_param_values[i].data(), param_values[i],
                   sizeof(float) * param_res[i]);
            m_param_strides[i] = param_res[i] > 1 ? slices : 0;
            slices *= m_param_size[i];
        }

        uint32_t n_values = xSize * ySize;

        m_data = FloatStorage(slices * n_values);

        if (build_cdf) {
            m_marginal_cdf = FloatStorage(slices * m_size.y);
            m_conditional_cdf = FloatStorage(slices * n_values);

            float *marginal_cdf = m_marginal_cdf.data(),
                  *conditional_cdf = m_conditional_cdf.data(), *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                /* Construct conditional CDF */
                for (int y = 0; y < m_size.y; ++y) {
                    double sum = 0.0;
                    size_t i = y * xSize;
                    conditional_cdf[i] = 0.f;
                    for (int x = 0; x < m_size.x - 1; ++x, ++i) {
                        sum += .5 * ((double)data[i] + (double)data[i + 1]);
                        conditional_cdf[i + 1] = (float)sum;
                    }
                }

                /* Construct marginal CDF */
                marginal_cdf[0] = 0.f;
                double sum = 0.0;
                for (int y = 0; y < m_size.y - 1; ++y) {
                    sum += .5 * ((double)conditional_cdf[(y + 1) * xSize - 1] +
                                 (double)conditional_cdf[(y + 2) * xSize - 1]);
                    marginal_cdf[y + 1] = (float)sum;
                }

                /* Normalize CDFs and PDF (if requested) */
                float normalization = 1.f / marginal_cdf[m_size.y - 1];
                for (size_t i = 0; i < n_values; ++i)
                    conditional_cdf[i] *= normalization;
                for (size_t i = 0; i < m_size.y; ++i)
                    marginal_cdf[i] *= normalization;
                for (size_t i = 0; i < n_values; ++i)
                    data_out[i] = data[i] * normalization;

                marginal_cdf += m_size.y;
                conditional_cdf += n_values;
                data_out += n_values;
                data += n_values;
            }
        } else {
            float *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                float normalization = 1.f / HProd(m_inv_patch_size);
                if (normalize) {
                    double sum = 0.0;
                    for (int y = 0; y < m_size.y - 1; ++y) {
                        size_t i = y * xSize;
                        for (int x = 0; x < m_size.x - 1; ++x, ++i) {
                            float v00 = data[i], v10 = data[i + 1], v01 = data[i + xSize],
                                  v11 = data[i + 1 + xSize],
                                  avg = .25f * (v00 + v10 + v01 + v11);
                            sum += (double)avg;
                        }
                    }
                    normalization = float(1.0 / sum);
                }

                for (uint32_t k = 0; k < n_values; ++k)
                    data_out[k] = data[k] * normalization;

                data += n_values;
                data_out += n_values;
            }
        }
    }